

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_simplification.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConjunctionSimplificationRule::RemoveExpression
          (ConjunctionSimplificationRule *this,BoundConjunctionExpression *conj,Expression *expr)

{
  Expression *this_00;
  reference pvVar1;
  _func_int **pp_Var2;
  Expression *in_RCX;
  long lVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  idx_t i;
  ulong __n;
  
  this_00 = expr + 1;
  __n = 0;
  do {
    pp_Var2 = expr[1].super_BaseExpression._vptr_BaseExpression;
    lVar3 = *(long *)&expr[1].super_BaseExpression.type;
    if ((ulong)(lVar3 - (long)pp_Var2 >> 3) <= __n) {
LAB_00589d92:
      if (lVar3 - (long)pp_Var2 == 8) {
        pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)this_00,0);
        _Var4._M_head_impl =
             (pvVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      }
      else {
        _Var4._M_head_impl = (Expression *)0x0;
      }
      (this->super_Rule)._vptr_Rule = (_func_int **)_Var4._M_head_impl;
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
    }
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)this_00,__n);
    if ((pvVar1->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == in_RCX) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::erase_at((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)this_00,__n);
      pp_Var2 = expr[1].super_BaseExpression._vptr_BaseExpression;
      lVar3._0_1_ = expr[1].super_BaseExpression.type;
      lVar3._1_1_ = expr[1].super_BaseExpression.expression_class;
      lVar3._2_6_ = *(undefined6 *)&expr[1].super_BaseExpression.field_0xa;
      goto LAB_00589d92;
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

unique_ptr<Expression> ConjunctionSimplificationRule::RemoveExpression(BoundConjunctionExpression &conj,
                                                                       const Expression &expr) {
	for (idx_t i = 0; i < conj.children.size(); i++) {
		if (conj.children[i].get() == &expr) {
			// erase the expression
			conj.children.erase_at(i);
			break;
		}
	}
	if (conj.children.size() == 1) {
		// one expression remaining: simply return that expression and erase the conjunction
		return std::move(conj.children[0]);
	}
	return nullptr;
}